

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_device.c
# Opt level: O0

void send_error_response(SOCKINFO *info,int error_code,char *err_msg,http_message_t *hmsg)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 local_c8 [8];
  membuffer headers;
  char err_code_str [30];
  char *end_body;
  char *mid_body;
  char *start_body;
  int local_60;
  int minor;
  int major;
  int timeout_secs;
  off_t content_length;
  http_message_t *hmsg_local;
  char *err_msg_local;
  SOCKINFO *pSStack_38;
  int error_code_local;
  SOCKINFO *info_local;
  
  minor = 0x1e;
  content_length = (off_t)hmsg;
  hmsg_local = (http_message_t *)err_msg;
  err_msg_local._4_4_ = error_code;
  pSStack_38 = info;
  memset(&headers.size_inc,0,0x1e);
  snprintf((char *)&headers.size_inc,0x1e,"%d",(ulong)err_msg_local._4_4_);
  sVar2 = strlen(
                "<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\">\n<s:Body>\n<s:Fault>\n<faultcode>s:Client</faultcode>\n<faultstring>UPnPError</faultstring>\n<detail>\n<UPnPError xmlns=\"urn:schemas-upnp-org:control-1-0\">\n<errorCode>"
                );
  sVar3 = strlen((char *)&headers.size_inc);
  sVar4 = strlen("</errorCode>\n<errorDescription>");
  sVar5 = strlen((char *)hmsg_local);
  sVar6 = strlen(
                "</errorDescription>\n</UPnPError>\n</detail>\n</s:Fault>\n</s:Body>\n</s:Envelope>\n"
                );
  _major = sVar2 + sVar3 + sVar4 + sVar5 + sVar6;
  http_CalcResponseVersion
            (*(int *)(content_length + 0x10c),*(int *)(content_length + 0x110),&local_60,
             (int *)((long)&start_body + 4));
  membuffer_init((membuffer *)local_c8);
  iVar1 = http_MakeMessage((membuffer *)local_c8,local_60,start_body._4_4_,"RNsDsSXccsssss",500,
                           _major,ContentTypeHeader,"EXT:\r\n","redsonic",
                           "<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\">\n<s:Body>\n<s:Fault>\n<faultcode>s:Client</faultcode>\n<faultstring>UPnPError</faultstring>\n<detail>\n<UPnPError xmlns=\"urn:schemas-upnp-org:control-1-0\">\n<errorCode>"
                           ,&headers.size_inc,"</errorCode>\n<errorDescription>",hmsg_local,
                           "</errorDescription>\n</UPnPError>\n</detail>\n</s:Fault>\n</s:Body>\n</s:Envelope>\n"
                          );
  if (iVar1 == 0) {
    http_SendMessage(pSStack_38,&minor,"b",local_c8,headers.buf);
    membuffer_destroy((membuffer *)local_c8);
  }
  else {
    membuffer_destroy((membuffer *)local_c8);
  }
  return;
}

Assistant:

static void send_error_response(
	/*! [in] Socket info. */
	SOCKINFO *info,
	/*! [in] Error code. */
	int error_code,
	/*! [in] Error message. */
	const char *err_msg,
	/*! [in] HTTP request. */
	http_message_t *hmsg)
{
	off_t content_length;
	int timeout_secs = SOAP_TIMEOUT;
	int major;
	int minor;
	const char *start_body =
		/*		"<?xml version=\"1.0\"?>\n" required?? */
		"<s:Envelope "
		"xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" "
		"s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/"
		"\">\n"
		"<s:Body>\n"
		"<s:Fault>\n"
		"<faultcode>s:Client</faultcode>\n"
		"<faultstring>UPnPError</faultstring>\n"
		"<detail>\n"
		"<UPnPError xmlns=\"urn:schemas-upnp-org:control-1-0\">\n"
		"<errorCode>";
	const char *mid_body = "</errorCode>\n"
			       "<errorDescription>";
	const char *end_body = "</errorDescription>\n"
			       "</UPnPError>\n"
			       "</detail>\n"
			       "</s:Fault>\n"
			       "</s:Body>\n"
			       "</s:Envelope>\n";
	char err_code_str[30];
	membuffer headers;

	memset(err_code_str, 0, sizeof(err_code_str));
	snprintf(err_code_str, sizeof(err_code_str), "%d", error_code);
	/* calc body len */
	content_length =
		(off_t)(strlen(start_body) + strlen(err_code_str) +
			strlen(mid_body) + strlen(err_msg) + strlen(end_body));
	http_CalcResponseVersion(
		hmsg->major_version, hmsg->minor_version, &major, &minor);
	/* make headers */
	membuffer_init(&headers);
	if (http_MakeMessage(&headers,
		    major,
		    minor,
		    "RNsDsSXcc"
		    "sssss",
		    500,
		    content_length,
		    ContentTypeHeader,
		    "EXT:\r\n",
		    X_USER_AGENT,
		    start_body,
		    err_code_str,
		    mid_body,
		    err_msg,
		    end_body) != 0) {
		membuffer_destroy(&headers);
		/* out of mem */
		return;
	}
	/* send err msg */
	http_SendMessage(info, &timeout_secs, "b", headers.buf, headers.length);
	membuffer_destroy(&headers);
}